

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRules2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg)

{
  bool bVar1;
  string *psVar2;
  string *remote_path;
  ostream *poVar3;
  string dir;
  string local_48;
  
  bVar1 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)lg);
  if (!bVar1) {
    psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)lg);
    remote_path = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)lg);
    cmLocalGenerator::MaybeConvertToRelativePath
              (&local_48,(cmLocalGenerator *)lg,psVar2,remote_path);
    cmSystemTools::ConvertToOutputPath(&dir,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    cmLocalUnixMakefileGenerator3::WriteDivider(lg,ruleFileStream);
    poVar3 = std::operator<<(ruleFileStream,"# Directory level rules for directory ");
    poVar3 = std::operator<<(poVar3,(string *)&dir);
    std::operator<<(poVar3,"\n\n");
    WriteDirectoryRule2(this,ruleFileStream,lg,"all",true,false);
    WriteDirectoryRule2(this,ruleFileStream,lg,"clean",false,false);
    WriteDirectoryRule2(this,ruleFileStream,lg,"preinstall",true,true);
    std::__cxx11::string::~string((string *)&dir);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRules2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg)
{
  // Only subdirectories need these rules.
  if (lg->IsRootMakefile()) {
    return;
  }

  // Begin the directory-level rules section.
  std::string dir =
    cmSystemTools::ConvertToOutputPath(lg->MaybeConvertToRelativePath(
      lg->GetBinaryDirectory(), lg->GetCurrentBinaryDirectory()));
  lg->WriteDivider(ruleFileStream);
  ruleFileStream << "# Directory level rules for directory " << dir << "\n\n";

  // Write directory-level rules for "all".
  this->WriteDirectoryRule2(ruleFileStream, lg, "all", true, false);

  // Write directory-level rules for "clean".
  this->WriteDirectoryRule2(ruleFileStream, lg, "clean", false, false);

  // Write directory-level rules for "preinstall".
  this->WriteDirectoryRule2(ruleFileStream, lg, "preinstall", true, true);
}